

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O3

void Res_SimCollectPatterns(Res_Sim_t *p,int fVerbose)

{
  uint *puVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  pAVar3 = p->pAig;
  iVar10 = pAVar3->vPos->nSize;
  if (0 < iVar10) {
    ppvVar4 = pAVar3->vPos->pArray;
    iVar9 = *(int *)((long)*ppvVar4 + 0x10);
    if (-1 < (long)iVar9) {
      pVVar5 = p->vPats;
      if ((iVar9 < pVVar5->nSize) && (iVar10 != 1)) {
        uVar2 = *(uint *)((long)ppvVar4[1] + 0x10);
        if ((-1 < (long)(int)uVar2) && (uVar2 < (uint)pVVar5->nSize)) {
          if (0 < p->nBytesIn) {
            ppvVar4 = pVVar5->pArray;
            pvVar6 = ppvVar4[iVar9];
            pvVar7 = ppvVar4[(int)uVar2];
            lVar11 = 0;
            do {
              if (*(char *)((long)pvVar6 + lVar11) != '\0') {
                if (*(char *)((long)pvVar7 + lVar11) == '\0') {
                  iVar10 = p->nPats0;
                  if (iVar10 < p->nPats) {
                    pVVar8 = pAVar3->vPis;
                    iVar9 = pVVar8->nSize;
                    if (0 < iVar9) {
                      uVar12 = 0;
                      do {
                        if (uVar12 == (uint)p->nTruePis) break;
                        iVar10 = *(int *)((long)pVVar8->pArray[uVar12] + 0x10);
                        if (((long)iVar10 < 0) || (pVVar5->nSize <= iVar10)) goto LAB_0046cf5b;
                        if (*(char *)((long)ppvVar4[iVar10] + lVar11) != '\0') {
                          if (*(char *)((long)ppvVar4[iVar10] + lVar11) != -1) {
                            __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                                          ,0x287,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
                          }
                          if ((long)p->vPats0->nSize <= (long)uVar12) goto LAB_0046cf5b;
                          puVar1 = (uint *)((long)p->vPats0->pArray[uVar12] +
                                           (long)(p->nPats0 >> 5) * 4);
                          *puVar1 = *puVar1 | 1 << ((byte)p->nPats0 & 0x1f);
                          iVar9 = pVVar8->nSize;
                        }
                        uVar12 = uVar12 + 1;
                      } while ((long)uVar12 < (long)iVar9);
                      iVar10 = p->nPats0;
                    }
                    iVar10 = iVar10 + 1;
                    p->nPats0 = iVar10;
                    goto LAB_0046ceec;
                  }
                }
                else {
                  if (*(char *)((long)pvVar7 + lVar11) != -1) {
                    __assert_fail("pInfoNode[i] == 0 || pInfoNode[i] == 0xff",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                                  ,0x27d,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
                  }
                  iVar10 = p->nPats1;
                  if (iVar10 < p->nPats) {
                    pVVar8 = pAVar3->vPis;
                    iVar9 = pVVar8->nSize;
                    if (0 < iVar9) {
                      uVar12 = 0;
                      do {
                        if (uVar12 == (uint)p->nTruePis) break;
                        iVar10 = *(int *)((long)pVVar8->pArray[uVar12] + 0x10);
                        if (((long)iVar10 < 0) || (pVVar5->nSize <= iVar10)) goto LAB_0046cf5b;
                        if (*(char *)((long)ppvVar4[iVar10] + lVar11) != '\0') {
                          if (*(char *)((long)ppvVar4[iVar10] + lVar11) != -1) {
                            __assert_fail("pInfo[i] == 0 || pInfo[i] == 0xff",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                                          ,0x296,"void Res_SimCollectPatterns(Res_Sim_t *, int)");
                          }
                          if ((long)p->vPats1->nSize <= (long)uVar12) goto LAB_0046cf5b;
                          puVar1 = (uint *)((long)p->vPats1->pArray[uVar12] +
                                           (long)(p->nPats1 >> 5) * 4);
                          *puVar1 = *puVar1 | 1 << ((byte)p->nPats1 & 0x1f);
                          iVar9 = pVVar8->nSize;
                        }
                        uVar12 = uVar12 + 1;
                      } while ((long)uVar12 < (long)iVar9);
                      iVar10 = p->nPats1;
                    }
                    p->nPats1 = iVar10 + 1;
                    iVar10 = p->nPats0;
LAB_0046ceec:
                    if ((p->nPats <= iVar10) && (p->nPats <= p->nPats1)) break;
                  }
                }
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < p->nBytesIn);
          }
          if (fVerbose != 0) {
            printf("|  ");
            printf("On = %3d  ",(ulong)(uint)p->nPats1);
            printf("Off = %3d  ",(ulong)(uint)p->nPats0);
            putchar(10);
            return;
          }
          return;
        }
      }
    }
  }
LAB_0046cf5b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimCollectPatterns( Res_Sim_t * p, int fVerbose )
{
    Abc_Obj_t * pObj;
    unsigned char * pInfoCare, * pInfoNode, * pInfo;
    int i, j;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        // skip don't-care patterns
        if ( !pInfoCare[i] )
            continue;
        // separate offset and onset patterns
        assert( pInfoNode[i] == 0 || pInfoNode[i] == 0xff );
        if ( !pInfoNode[i] )
        {
            if ( p->nPats0 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats0, j), p->nPats0 );
            }
            p->nPats0++;
        }
        else
        {
            if ( p->nPats1 >= p->nPats )
                continue;
            Abc_NtkForEachPi( p->pAig, pObj, j )
            {
                if ( j == p->nTruePis )
                    break;
                pInfo = (unsigned char *)Vec_PtrEntry( p->vPats, pObj->Id );
                assert( pInfo[i] == 0 || pInfo[i] == 0xff );
                if ( pInfo[i] )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(p->vPats1, j), p->nPats1 );
            }
            p->nPats1++;
        }
        if ( p->nPats0 >= p->nPats && p->nPats1 >= p->nPats )
            break;
    }
    if ( fVerbose )
    {
        printf( "|  " );
        printf( "On = %3d  ", p->nPats1 );
        printf( "Off = %3d  ", p->nPats0 );
        printf( "\n" );
    }
}